

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

FillLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_filllike(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x438) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x438;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.filllike_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FillLikeLayerParams>
                   (arena);
    (this->layer_).filllike_ = (FillLikeLayerParams *)LVar2;
  }
  return (FillLikeLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::FillLikeLayerParams* NeuralNetworkLayer::_internal_mutable_filllike() {
  if (!_internal_has_filllike()) {
    clear_layer();
    set_has_filllike();
    layer_.filllike_ = CreateMaybeMessage< ::CoreML::Specification::FillLikeLayerParams >(GetArenaForAllocation());
  }
  return layer_.filllike_;
}